

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall
lattice::graph::graph
          (graph *this,basis *bs,unitcell *cell,span_t *span,
          vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_> *boundary)

{
  EVP_PKEY_CTX *in_RSI;
  graph *in_RDI;
  supercell *this_00;
  span_t *in_stack_ffffffffffffff48;
  supercell *in_stack_ffffffffffffff50;
  
  std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::vector
            ((vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_> *)0x1035e9);
  this_00 = (supercell *)&in_RDI->coordinates_;
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)0x1035fc);
  std::vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>::vector
            ((vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_> *)0x10360f);
  supercell::supercell(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  init(in_RDI,in_RSI);
  supercell::~supercell(this_00);
  return;
}

Assistant:

graph(const basis& bs, const unitcell& cell, const span_t& span,
        const std::vector<boundary_t>& boundary) {
    init(bs, cell, supercell(span), boundary);
  }